

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstracteventdispatcher.cpp
# Opt level: O0

QAbstractEventDispatcher * QAbstractEventDispatcher::instance(QThread *thread)

{
  Type pQVar1;
  long in_RDI;
  QThreadData *data;
  
  if (in_RDI == 0) {
    QThreadData::current();
  }
  else {
    QThreadData::get2((QThread *)0x327c1f);
  }
  pQVar1 = QBasicAtomicPointer<QAbstractEventDispatcher>::loadRelaxed
                     ((QBasicAtomicPointer<QAbstractEventDispatcher> *)0x327c45);
  return pQVar1;
}

Assistant:

QAbstractEventDispatcher *QAbstractEventDispatcher::instance(QThread *thread)
{
    QThreadData *data = thread ? QThreadData::get2(thread) : QThreadData::current();
    return data->eventDispatcher.loadRelaxed();
}